

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O1

void lydxml_log_namespace_err
               (lyxml_ctx *xmlctx,char *prefix,size_t prefix_len,char *attr_name,size_t attr_len)

{
  ly_ctx *ctx;
  undefined8 in_RAX;
  
  ctx = xmlctx->ctx;
  if (attr_len != 0 && prefix_len != 0) {
    ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Unknown XML prefix \"%.*s\" at attribute \"%.*s\".",
            prefix_len,prefix,attr_len,attr_name,
            CONCAT71((int7)((ulong)in_RAX >> 8),prefix_len == 0));
    return;
  }
  if (prefix_len != 0) {
    ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Unknown XML prefix \"%.*s\".",prefix_len,prefix);
    return;
  }
  ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Missing XML namespace.",0,prefix);
  return;
}

Assistant:

static void
lydxml_log_namespace_err(struct lyxml_ctx *xmlctx, const char *prefix, size_t prefix_len,
        const char *attr_name, size_t attr_len)
{
    if (prefix_len && attr_len) {
        LOGVAL(xmlctx->ctx, LYVE_REFERENCE, "Unknown XML prefix \"%.*s\" at attribute \"%.*s\".",
                (int)prefix_len, prefix, (int)attr_len, attr_name);
    } else if (prefix_len) {
        LOGVAL(xmlctx->ctx, LYVE_REFERENCE, "Unknown XML prefix \"%.*s\".",
                (int)prefix_len, prefix);
    } else {
        LOGVAL(xmlctx->ctx, LYVE_REFERENCE, "Missing XML namespace.");
    }
}